

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void fail_if_leftover_values(char *test_name)

{
  ListNode *head;
  ListNode *pLVar1;
  undefined8 *puVar2;
  bool bVar3;
  ListNode *__ptr;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *cleanup_value_data;
  int quit_application;
  long *in_FS_OFFSET;
  ListNode *pLVar8;
  
  lVar7 = *in_FS_OFFSET;
  remove_always_return_values((ListNode *)(lVar7 + -400),1);
  sVar5 = check_for_leftover_values
                    ((ListNode *)(lVar7 + -400),"%s() has remaining non-returned values.\n",1);
  remove_always_return_values((ListNode *)(lVar7 + -0x140),2);
  cleanup_value_data = "\'%s\' parameter still has values that haven\'t been checked.\n";
  sVar6 = check_for_leftover_values
                    ((ListNode *)(lVar7 + -0x140),
                     "\'%s\' parameter still has values that haven\'t been checked.\n",2);
  bVar3 = sVar6 != 0 || sVar5 != 0;
  head = (ListNode *)(lVar7 + -0x160);
  pLVar8 = *(ListNode **)(lVar7 + -0x150);
  while (__ptr = pLVar8, __ptr != head) {
    pLVar8 = __ptr->next;
    if (__ptr->refcount < -1) {
      pLVar1 = __ptr->prev;
      pLVar1->next = pLVar8;
      pLVar8->prev = pLVar1;
      free_value(__ptr->value,cleanup_value_data);
      free(__ptr);
    }
  }
  pLVar8 = head;
  iVar4 = list_empty(head);
  quit_application = (int)pLVar8;
  pLVar8 = *(ListNode **)(lVar7 + -0x150);
  if (pLVar8 == head || iVar4 != 0) {
    if (bVar3) {
LAB_00123bba:
      exit_test(quit_application);
    }
  }
  else {
    lVar7 = 0;
    do {
      puVar2 = (undefined8 *)pLVar8->value;
      cm_print_error("%s function was expected to be called but was not.\n","%s",puVar2[2]);
      quit_application = 0x12b2ff;
      cm_print_error("%s:%u: note: remaining item was declared here\n",*puVar2,
                     (ulong)*(uint *)(puVar2 + 1));
      pLVar8 = pLVar8->next;
      lVar7 = lVar7 + -1;
    } while (pLVar8 != head);
    if (lVar7 != 0 || bVar3) goto LAB_00123bba;
  }
  return;
}

Assistant:

static void fail_if_leftover_values(const char *test_name) {
    int error_occurred = 0;
    (void)test_name;
    remove_always_return_values(&global_function_result_map_head, 1);
    if (check_for_leftover_values(
            &global_function_result_map_head,
            "%s() has remaining non-returned values.\n", 1)) {
        error_occurred = 1;
    }

    remove_always_return_values(&global_function_parameter_map_head, 2);
    if (check_for_leftover_values(
            &global_function_parameter_map_head,
            "'%s' parameter still has values that haven't been checked.\n",
            2)) {
        error_occurred = 1;
    }

    remove_always_return_values_from_list(&global_call_ordering_head);
    if (check_for_leftover_values_list(&global_call_ordering_head,
        "%s function was expected to be called but was not.\n")) {
        error_occurred = 1;
    }
    if (error_occurred) {
        exit_test(1);
    }
}